

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  FancyInteger f;
  Integer k;
  Integer A;
  Integer z;
  Integer j;
  Integer i;
  FancyInteger local_30;
  Integer local_2c;
  Integer local_28;
  Integer local_24;
  Integer local_20;
  Integer local_1c;
  
  local_1c.value = 5;
  local_20.value = 3;
  local_24.value = 100;
  local_28.value = 5;
  Integer::operator=(&local_28,&local_20);
  Integer::print(&local_24);
  Integer::print(&local_1c);
  local_2c.value = local_1c.value + local_20.value;
  local_1c.value = 1000;
  Integer::print(&local_2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i=",2);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1c.value);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"j=",2);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_20.value);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  local_30.super_Integer.value = (Integer)1;
  FancyInteger::print_fancy(&local_30);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto F = 3.14f;

//    auto a = 555i; // Integer(555) // possible with user defined literals

//    Integer i(5);
    auto i = Integer(5);

//    Integer j(3);
    auto j = Integer(3);

//    Integer z('Z');
    auto z = Integer('Z');

    //Integer A(i); // this is copy construction
    auto A = Integer(i);
    // ...
    // ...
    A = j; // copy assignment

    z.print();
    i.print(); //OOP style

//    Integer k = operator+(i, j);
//    Integer k = i + j;
    auto k = i + j;
    k.print();
    std::cout << "i=" << i.value << std::endl;
    std::cout << "j=" << j.value << std::endl;

//    FancyInteger f(1);
    auto f = FancyInteger(1);
    f.print_fancy();

//    operator<<(std::cout, "Hello");
//    std::cout << "Hello";

    return 0;
}